

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# licm_pass.cpp
# Opt level: O2

Status __thiscall
spvtools::opt::LICMPass::AnalyseAndHoistFromBB
          (LICMPass *this,Loop *loop,Function *f,BasicBlock *bb,
          vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *loop_bbs)

{
  pointer ppDVar1;
  bool bVar2;
  DominatorTree *this_00;
  DominatorTreeNode *pDVar3;
  Status SVar4;
  pointer ppDVar5;
  bool modified;
  Loop *loop_local;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  modified = false;
  local_50._8_8_ = 0;
  loop_local = loop;
  local_50._M_unused._M_object = operator_new(0x18);
  *(LICMPass **)local_50._M_unused._0_8_ = this;
  *(Loop ***)((long)local_50._M_unused._0_8_ + 8) = &loop_local;
  *(bool **)((long)local_50._M_unused._0_8_ + 0x10) = &modified;
  local_38 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/licm_pass.cpp:86:7)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/licm_pass.cpp:86:7)>
             ::_M_manager;
  bVar2 = IsImmediatelyContainedInLoop(this,loop,f,bb);
  if (bVar2) {
    SVar4 = Failure;
    bVar2 = BasicBlock::WhileEachInst
                      (bb,(function<bool_(spvtools::opt::Instruction_*)> *)&local_50,false);
    if (!bVar2) goto LAB_00208843;
  }
  this_00 = (DominatorTree *)IRContext::GetDominatorAnalysis((this->super_Pass).context_,f);
  pDVar3 = DominatorTree::GetTreeNode(this_00,bb);
  ppDVar1 = (pDVar3->children_).
            super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppDVar5 = (pDVar3->children_).
                 super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppDVar5 != ppDVar1;
      ppDVar5 = ppDVar5 + 1) {
    pDVar3 = *ppDVar5;
    bVar2 = Loop::IsInsideLoop(loop_local,pDVar3->bb_);
    if (bVar2) {
      std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
      push_back(loop_bbs,&pDVar3->bb_);
    }
  }
  SVar4 = modified ^ SuccessWithoutChange;
LAB_00208843:
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  return SVar4;
}

Assistant:

Pass::Status LICMPass::AnalyseAndHoistFromBB(
    Loop* loop, Function* f, BasicBlock* bb,
    std::vector<BasicBlock*>* loop_bbs) {
  bool modified = false;
  std::function<bool(Instruction*)> hoist_inst =
      [this, &loop, &modified](Instruction* inst) {
        if (loop->ShouldHoistInstruction(*inst)) {
          if (!HoistInstruction(loop, inst)) {
            return false;
          }
          modified = true;
        }
        return true;
      };

  if (IsImmediatelyContainedInLoop(loop, f, bb)) {
    if (!bb->WhileEachInst(hoist_inst, false)) {
      return Status::Failure;
    }
  }

  DominatorAnalysis* dom_analysis = context()->GetDominatorAnalysis(f);
  DominatorTree& dom_tree = dom_analysis->GetDomTree();

  for (DominatorTreeNode* child_dom_tree_node : *dom_tree.GetTreeNode(bb)) {
    if (loop->IsInsideLoop(child_dom_tree_node->bb_)) {
      loop_bbs->push_back(child_dom_tree_node->bb_);
    }
  }

  return (modified ? Status::SuccessWithChange : Status::SuccessWithoutChange);
}